

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O1

QPixmap * __thiscall
PixmapEntry::pixmap(QPixmap *__return_storage_ptr__,PixmapEntry *this,QSize *size,Mode mode,
                   State state,qreal scale)

{
  QPixmap *this_00;
  QExplicitlySharedDataPointer<QPlatformPixmap> QVar1;
  bool bVar2;
  totally_ordered_wrapper<QPlatformPixmap_*> tVar3;
  QSize QVar4;
  long lVar5;
  ulong uVar6;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar7;
  uint uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  qreal scaleFactor;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar13;
  undefined1 auVar12 [16];
  QSize actualSize;
  QString local_b8;
  QSize local_98;
  QPixmap local_90;
  undefined1 local_78 [8];
  char *pcStack_70;
  QExplicitlySharedDataPointer<QPlatformPixmap> local_68;
  HexString<unsigned_char> local_60;
  HexString<unsigned_long_long> local_58;
  HexString<unsigned_int> local_50;
  HexString<unsigned_int> local_48;
  HexString<unsigned_short> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->basePixmap;
  bVar2 = QPixmap::isNull(this_00);
  uVar7 = extraout_EDX;
  if (bVar2) {
    QPixmap::load(this_00,&(this->super_QIconLoaderEngineEntry).filename,(char *)0x0,
                  (ImageConversionFlags)0x0);
    uVar7 = extraout_EDX_00;
  }
  local_98 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  dVar11 = scale * (double)(*size).wd.m_i;
  dVar13 = scale * (double)(*size).ht.m_i;
  auVar12._0_8_ = (double)((ulong)dVar11 & 0x8000000000000000 | 0x3fe0000000000000) + dVar11;
  auVar12._8_8_ = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
  auVar12 = minpd(_DAT_00684790,auVar12);
  auVar10._8_8_ = -(ulong)(-2147483648.0 < auVar12._8_8_);
  auVar10._0_8_ = -(ulong)(-2147483648.0 < auVar12._0_8_);
  uVar8 = movmskpd(uVar7,auVar10);
  uVar9 = 0x8000000000000000;
  if ((uVar8 & 2) != 0) {
    uVar9 = (ulong)(uint)(int)auVar12._8_8_ << 0x20;
  }
  uVar6 = 0x80000000;
  if ((uVar8 & 1) != 0) {
    uVar6 = (ulong)(uint)(int)auVar12._0_8_;
  }
  local_b8.d.d = (Data *)(uVar6 | uVar9);
  local_78 = (undefined1  [8])QPixmap::size(this_00);
  if ((local_78._0_4_ != 0 || local_78._4_4_ != 0) &&
     (((int)local_b8.d.d < local_78._0_4_ || (local_b8.d.d._4_4_ < (int)local_78._4_4_)))) {
    local_78 = (undefined1  [8])QSize::scaled((QSize *)local_78,(AspectRatioMode)&local_b8);
  }
  local_98.wd.m_i = local_78._0_4_;
  local_98.ht.m_i = local_78._4_4_;
  scaleFactor = QIconPrivate::pixmapDevicePixelRatio(scale,size,&local_98);
  local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tVar3.ptr = (QPlatformPixmap *)QPixmap::cacheKey(this_00);
  QGuiApplication::palette();
  local_58.val = QPalette::cacheKey((QPalette *)&local_90);
  local_78._0_4_ = 10;
  local_78._4_4_ = 0;
  pcStack_70 = "$qt_theme_";
  local_60.val = (uchar)mode;
  local_50.val = local_98.wd.m_i;
  local_48.val = local_98.ht.m_i;
  local_40.val = (unsigned_short)
                 (int)((double)((ulong)(scaleFactor * 1000.0) & 0x8000000000000000 |
                               (ulong)DAT_00684780) + scaleFactor * 1000.0);
  local_68.d.ptr =
       (totally_ordered_wrapper<QPlatformPixmap_*>)
       (totally_ordered_wrapper<QPlatformPixmap_*>)tVar3.ptr;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
  ::convertTo<QString>
            (&local_b8,
             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
              *)local_78);
  QPalette::~QPalette((QPalette *)&local_90);
  (__return_storage_ptr__->data).d.ptr = (QPlatformPixmap *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap(__return_storage_ptr__);
  bVar2 = QPixmapCache::find(&local_b8,__return_storage_ptr__);
  if (!bVar2) {
    QVar4 = QPixmap::size(this_00);
    if ((local_98.wd.m_i == QVar4.wd.m_i.m_i) && (local_98.ht.m_i == QVar4.ht.m_i.m_i)) {
      QPixmap::operator=(__return_storage_ptr__,this_00);
    }
    else {
      QPixmap::scaled(&local_90,this_00,&local_98,IgnoreAspectRatio,SmoothTransformation);
      local_68.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      pcStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      QPaintDevice::QPaintDevice((QPaintDevice *)local_78);
      QVar1.d.ptr = local_90.data.d.ptr;
      local_78 = (undefined1  [8])&PTR__QPixmap_007e3618;
      local_90.data.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
      local_68.d.ptr =
           (totally_ordered_wrapper<QPlatformPixmap_*>)(__return_storage_ptr__->data).d.ptr;
      (__return_storage_ptr__->data).d.ptr = (QPlatformPixmap *)QVar1.d.ptr;
      QPixmap::~QPixmap((QPixmap *)local_78);
      QPixmap::~QPixmap(&local_90);
    }
    lVar5 = QMetaObject::cast((QObject *)&QGuiApplication::staticMetaObject);
    if (lVar5 != 0) {
      (**(code **)(**(long **)(lVar5 + 8) + 0x70))
                (&local_90,*(long **)(lVar5 + 8),mode,__return_storage_ptr__);
      local_68.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      pcStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      QPaintDevice::QPaintDevice((QPaintDevice *)local_78);
      QVar1.d.ptr = local_90.data.d.ptr;
      local_78 = (undefined1  [8])&PTR__QPixmap_007e3618;
      local_90.data.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
      local_68.d.ptr =
           (totally_ordered_wrapper<QPlatformPixmap_*>)(__return_storage_ptr__->data).d.ptr;
      (__return_storage_ptr__->data).d.ptr = (QPlatformPixmap *)QVar1.d.ptr;
      QPixmap::~QPixmap((QPixmap *)local_78);
      QPixmap::~QPixmap(&local_90);
    }
    QPixmap::setDevicePixelRatio(__return_storage_ptr__,scaleFactor);
    QPixmapCache::insert(&local_b8,__return_storage_ptr__);
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap PixmapEntry::pixmap(const QSize &size, QIcon::Mode mode, QIcon::State state, qreal scale)
{
    Q_UNUSED(state);

    // Ensure that basePixmap is lazily initialized before generating the
    // key, otherwise the cache key is not unique
    if (basePixmap.isNull())
        basePixmap.load(filename);

    // If the size of the best match we have (basePixmap) is larger than the
    // requested size, we downscale it to match.
    const auto actualSize = QPixmapIconEngine::adjustSize(size * scale, basePixmap.size());
    const auto calculatedDpr = QIconPrivate::pixmapDevicePixelRatio(scale, size, actualSize);
    QString key = "$qt_theme_"_L1
                  % HexString<quint64>(basePixmap.cacheKey())
                  % HexString<quint8>(mode)
                  % HexString<quint64>(QGuiApplication::palette().cacheKey())
                  % HexString<uint>(actualSize.width())
                  % HexString<uint>(actualSize.height())
                  % HexString<quint16>(qRound(calculatedDpr * 1000));

    QPixmap cachedPixmap;
    if (QPixmapCache::find(key, &cachedPixmap)) {
        return cachedPixmap;
    } else {
        if (basePixmap.size() != actualSize)
            cachedPixmap = basePixmap.scaled(actualSize, Qt::IgnoreAspectRatio, Qt::SmoothTransformation);
        else
            cachedPixmap = basePixmap;
        if (QGuiApplication *guiApp = qobject_cast<QGuiApplication *>(qApp))
            cachedPixmap = static_cast<QGuiApplicationPrivate*>(QObjectPrivate::get(guiApp))->applyQIconStyleHelper(mode, cachedPixmap);
        cachedPixmap.setDevicePixelRatio(calculatedDpr);
        QPixmapCache::insert(key, cachedPixmap);
    }
    return cachedPixmap;
}